

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::~TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapePrism> *this,void **vtt)

{
  TPZGeoEl *this_00;
  TPZChunkVector<TPZConnect,_10> *pTVar1;
  long *nelem;
  long *in_RSI;
  TPZCompEl *in_RDI;
  int ic;
  int64_t nconnects;
  TPZStack<long,_10> connectlist;
  TPZCompEl *cel;
  TPZGeoEl *gel;
  TPZManVector<long,_21> *in_stack_ffffffffffffff10;
  TPZCompEl *in_stack_ffffffffffffff18;
  TPZAdmChunkVector<TPZConnect,_10> *in_stack_ffffffffffffff20;
  TPZChunkVector<TPZConnect,_10> *this_01;
  int local_9c;
  TPZVec<long> local_90 [3];
  TPZCompEl *local_20;
  TPZGeoEl *local_18;
  
  *(long *)in_RDI = *in_RSI;
  *(long *)((long)&in_RDI->field_0x0 + *(long *)(*(long *)in_RDI + -0x60)) = in_RSI[9];
  local_18 = TPZCompEl::Reference(in_stack_ffffffffffffff18);
  if (local_18 != (TPZGeoEl *)0x0) {
    local_20 = TPZGeoEl::Reference(local_18);
    if (local_20 == in_RDI) {
      (**(code **)(*(long *)in_RDI + 0x358))(in_RDI,1);
    }
    this_00 = TPZCompEl::Reference(in_stack_ffffffffffffff18);
    TPZGeoEl::ResetReference(this_00);
  }
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_ffffffffffffff20);
  (**(code **)(*(long *)in_RDI + 0x1e0))(in_RDI,local_90);
  pTVar1 = (TPZChunkVector<TPZConnect,_10> *)TPZVec<long>::size(local_90);
  this_01 = pTVar1;
  for (local_9c = 0; (long)local_9c < (long)pTVar1; local_9c = local_9c + 1) {
    nelem = TPZVec<long>::operator[](local_90,(long)local_9c);
    if (*nelem != -1) {
      in_stack_ffffffffffffff20 = TPZCompMesh::ConnectVec(in_RDI->fMesh);
      in_stack_ffffffffffffff18 = (TPZCompEl *)TPZVec<long>::operator[](local_90,(long)local_9c);
      in_stack_ffffffffffffff10 =
           (TPZManVector<long,_21> *)
           TPZChunkVector<TPZConnect,_10>::operator[](this_01,(int64_t)nelem);
      TPZConnect::DecrementElConnected((TPZConnect *)in_stack_ffffffffffffff10);
    }
  }
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1c0a0f9);
  TPZManVector<long,_21>::~TPZManVector(in_stack_ffffffffffffff10);
  TPZIntelGen<pzshape::TPZShapePrism>::~TPZIntelGen
            ((TPZIntelGen<pzshape::TPZShapePrism> *)in_stack_ffffffffffffff20,
             (void **)in_stack_ffffffffffffff18);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::~TPZCompElH1() {
    TPZGeoEl *gel = this->Reference();
    if (gel) {
        TPZCompEl *cel = gel->Reference();
        if (cel == this) {
            this->RemoveSideRestraintsII(this->EDelete);
        }
        this->Reference()->ResetReference();
    }
    TPZStack<int64_t > connectlist;
    this->BuildConnectList(connectlist);
    int64_t nconnects = connectlist.size();
    for (int ic = 0; ic < nconnects; ic++) {
        if (connectlist[ic] != -1){
            this->fMesh->ConnectVec()[connectlist[ic]].DecrementElConnected();
        }
    }
}